

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_rotc_rm_T1(DisasContext *s,MemOp ot,int op1,int is_right)

{
  TCGv_i64 ret;
  TCGv_i64 addr;
  TCGContext *pTVar1;
  TCGArg a2;
  TCGTemp *ts;
  uintptr_t o;
  
  gen_compute_eflags(s);
  ret = s->T0;
  if (op1 == 0x10) {
    addr = s->A0;
    pTVar1 = s->uc->tcg_ctx;
    if (s->uc->hook[10].head != (list_item *)0x0) {
      a2 = s->prev_pc;
      ts = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)ts,a2);
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                         0x80);
      tcg_temp_free_internal_x86_64(pTVar1,ts);
    }
    tcg_gen_qemu_ld_i64_x86_64(pTVar1,ret,addr,(long)s->mem_index,ot);
  }
  else {
    pTVar1 = s->uc->tcg_ctx;
    if ((op1 - 8U < 0xfffffffc || ot != MO_8) || (s->x86_64_hregs != false)) {
      if (pTVar1->cpu_regs[op1] != ret) {
        tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(ret + (long)pTVar1),
                           (TCGArg)(pTVar1->cpu_regs[op1] + (long)pTVar1));
      }
    }
    else {
      tcg_gen_extract_i64_x86_64(pTVar1,ret,pTVar1->cpu_regs[op1 - 4],8,8);
    }
  }
  if (is_right != 0) {
    (*(code *)(&DAT_00d6c400 + *(int *)(&DAT_00d6c400 + (ulong)ot * 4)))();
    return;
  }
  (*(code *)(&DAT_00d6c410 + *(int *)(&DAT_00d6c410 + (ulong)ot * 4)))();
  return;
}

Assistant:

static void gen_rotc_rm_T1(DisasContext *s, MemOp ot, int op1,
                           int is_right)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    gen_compute_eflags(s);
    // assert(s->cc_op == CC_OP_EFLAGS);

    /* load */
    if (op1 == OR_TMP0)
        gen_op_ld_v(s, ot, s->T0, s->A0);
    else
        gen_op_mov_v_reg(s, ot, s->T0, op1);
    
    if (is_right) {
        switch (ot) {
        case MO_8:
            gen_helper_rcrb(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_16:
            gen_helper_rcrw(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_32:
            gen_helper_rcrl(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#ifdef TARGET_X86_64
        case MO_64:
            gen_helper_rcrq(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#endif
        default:
            tcg_abort();
        }
    } else {
        switch (ot) {
        case MO_8:
            gen_helper_rclb(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_16:
            gen_helper_rclw(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_32:
            gen_helper_rcll(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#ifdef TARGET_X86_64
        case MO_64:
            gen_helper_rclq(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#endif
        default:
            tcg_abort();
        }
    }
    /* store */
    gen_op_st_rm_T0_A0(s, ot, op1);
}